

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

void __thiscall vkt::shaderexecutor::CompoundStatement::doPrint(CompoundStatement *this,ostream *os)

{
  long *plVar1;
  pointer pSVar2;
  ulong uVar3;
  long lVar4;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"{\n",2);
  pSVar2 = (this->m_statements).
           super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_statements).
      super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
      ._M_impl.super__Vector_impl_data._M_finish != pSVar2) {
    lVar4 = 0;
    uVar3 = 0;
    do {
      plVar1 = *(long **)((long)&(pSVar2->super_SharedPtr<const_vkt::shaderexecutor::Statement>).
                                 m_ptr + lVar4);
      (**(code **)(*plVar1 + 0x10))(plVar1,os);
      uVar3 = uVar3 + 1;
      pSVar2 = (this->m_statements).
               super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 0x10;
    } while (uVar3 < (ulong)((long)(this->m_statements).
                                   super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar2 >> 4));
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"}\n",2);
  return;
}

Assistant:

void				doPrint				(ostream&		os)						const
	{
		os << "{\n";

		for (size_t ndx = 0; ndx < m_statements.size(); ++ndx)
			os << *m_statements[ndx];

		os << "}\n";
	}